

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O2

bool __thiscall TextProviderString::is_valid(TextProviderString *this)

{
  if ((this->super_TextProvider).m_has_error != false) {
    return false;
  }
  return (bool)((this->m_iterator).
                super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_engaged ^ 1U |
               (this->m_iterator).
               super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_payload !=
               (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                )((this->m_text)._M_dataplus._M_p + (this->m_text)._M_string_length));
}

Assistant:

bool TextProviderString::is_valid()
{
	return TextProvider::is_valid() && m_iterator != m_text.end();
}